

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

int * Gia_ManDeriveNexts(Gia_Man_t *p)

{
  int iVar1;
  Gia_Rpr_t *pGVar2;
  int *piVar3;
  void *__ptr;
  size_t sVar4;
  uint uVar5;
  size_t __nmemb;
  
  pGVar2 = p->pReprs;
  if (pGVar2 == (Gia_Rpr_t *)0x0) {
    __assert_fail("p->pReprs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                  ,0x108,"int *Gia_ManDeriveNexts(Gia_Man_t *)");
  }
  if (p->pNexts == (int *)0x0) {
    iVar1 = p->nObjs;
    __nmemb = (size_t)iVar1;
    piVar3 = (int *)calloc(__nmemb,4);
    __ptr = malloc(__nmemb * 4);
    if (0 < (long)__nmemb) {
      sVar4 = 0;
      do {
        *(int *)((long)__ptr + sVar4 * 4) = (int)sVar4;
        sVar4 = sVar4 + 1;
      } while (__nmemb != sVar4);
    }
    if (0 < iVar1) {
      sVar4 = 0;
      do {
        uVar5 = (uint)pGVar2[sVar4] & 0xfffffff;
        if ((uVar5 != 0) && (uVar5 != 0xfffffff)) {
          piVar3[*(uint *)((long)__ptr + (ulong)uVar5 * 4)] = (int)sVar4;
          *(int *)((long)__ptr + (ulong)uVar5 * 4) = (int)sVar4;
        }
        sVar4 = sVar4 + 1;
      } while (__nmemb != sVar4);
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
    return piVar3;
  }
  __assert_fail("p->pNexts == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                ,0x109,"int *Gia_ManDeriveNexts(Gia_Man_t *)");
}

Assistant:

int * Gia_ManDeriveNexts( Gia_Man_t * p )
{
    unsigned * pNexts, * pTails;
    int i;
    assert( p->pReprs != NULL );
    assert( p->pNexts == NULL );
    pNexts = ABC_CALLOC( unsigned, Gia_ManObjNum(p) );
    pTails = ABC_ALLOC( unsigned, Gia_ManObjNum(p) );
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        pTails[i] = i;
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
    {
        if ( !p->pReprs[i].iRepr || p->pReprs[i].iRepr == GIA_VOID )
            continue;
        pNexts[ pTails[p->pReprs[i].iRepr] ] = i;
        pTails[p->pReprs[i].iRepr] = i;
    }
    ABC_FREE( pTails );
    return (int *)pNexts;
}